

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

void HostGame(int i)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  uint uVar25;
  char *__nptr;
  BYTE BVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  int iVar40;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar41;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  int iVar64;
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  PreGamePacket packet;
  int gotack [9];
  undefined2 local_9c [34];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 local_38;
  long lVar44;
  
  iVar24 = DArgs::NumArgs(Args);
  uVar28 = 2;
  if (iVar24 + -1 != i) {
    __nptr = DArgs::GetArg(Args,i + 1);
    uVar25 = atoi(__nptr);
    if (uVar25 != 0) {
      if (8 < (int)uVar25) {
        I_FatalError("You cannot host a game with %d players. The limit is currently %d.",
                     (ulong)uVar25,8);
        return;
      }
      uVar28 = uVar25;
      if (uVar25 == 1) {
        doomcom.id = 0x12345678;
        doomcom.numnodes = 1;
        doomcom.consoleplayer = 0;
        doomcom.numplayers = 1;
        netgame = false;
        multiplayer = true;
        return;
      }
    }
  }
  StartNetwork(false);
  doomcom._16_4_ = doomcom._16_4_ & 0xffff0000;
  Printf("Console player number: %d\n",0);
  doomcom.numnodes = 1;
  addterm(SendAbort,"SendAbort");
  (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Waiting for players",(ulong)uVar28);
  iVar24 = (*StartScreen->_vptr_FStartupScreen[9])
                     (StartScreen,Host_CheckForConnects,(long)(int)uVar28);
  if ((char)iVar24 != '\0') {
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_38 = 0;
    (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Sending all here.");
    (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Done waiting",1);
    iVar24 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Host_SendAllHere,local_58);
    if ((char)iVar24 != '\0') {
      popterm();
      (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Go");
      local_9c[0] = 0x730;
      if (1 < doomcom.numnodes) {
        lVar29 = 1;
        do {
          iVar24 = -8;
          do {
            sendto(mysocket,local_9c,2,0,(sockaddr *)(sendaddress + lVar29),0x10);
            iVar24 = iVar24 + 1;
          } while (iVar24 != 0);
          lVar29 = lVar29 + 1;
        } while (lVar29 < doomcom.numnodes);
      }
      (*StartScreen->_vptr_FStartupScreen[7])
                (StartScreen,"Total players: %d",(ulong)(uint)(int)doomcom.numnodes);
      auVar23 = _DAT_0073b300;
      doomcom.id = 0x12345678;
      doomcom.numplayers = doomcom.numnodes;
      if (0 < (long)doomcom.numnodes) {
        iVar24 = (int)doomcom.numnodes;
        lVar29 = (long)doomcom.numnodes + -1;
        auVar30._8_4_ = (int)lVar29;
        auVar30._0_8_ = lVar29;
        auVar30._12_4_ = (int)((ulong)lVar29 >> 0x20);
        uVar27 = 0;
        auVar31 = auVar30;
        auVar43 = _DAT_0073c3b0;
        auVar45 = _DAT_0073c3c0;
        auVar46 = _DAT_0073c3d0;
        auVar47 = _DAT_0073c3e0;
        auVar48 = _DAT_0073c180;
        auVar49 = _DAT_0073c190;
        auVar50 = _DAT_0073c1a0;
        auVar51 = _DAT_0073b2f0;
        do {
          auVar61 = auVar30 ^ auVar23;
          auVar65 = auVar51 ^ auVar23;
          iVar40 = auVar61._0_4_;
          iVar78 = -(uint)(iVar40 < auVar65._0_4_);
          iVar42 = auVar61._4_4_;
          auVar67._4_4_ = -(uint)(iVar42 < auVar65._4_4_);
          iVar63 = auVar61._8_4_;
          iVar82 = -(uint)(iVar63 < auVar65._8_4_);
          iVar64 = auVar61._12_4_;
          auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
          auVar61._4_4_ = iVar78;
          auVar61._0_4_ = iVar78;
          auVar61._8_4_ = iVar82;
          auVar61._12_4_ = iVar82;
          auVar61 = pshuflw(auVar31,auVar61,0xe8);
          auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar42);
          auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar52 = pshuflw(in_XMM11,auVar66,0xe8);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar65 = pshuflw(auVar61,auVar67,0xe8);
          auVar31._8_4_ = 0xffffffff;
          auVar31._0_8_ = 0xffffffffffffffff;
          auVar31._12_4_ = 0xffffffff;
          auVar31 = (auVar65 | auVar52 & auVar61) ^ auVar31;
          auVar31 = packssdw(auVar31,auVar31);
          BVar26 = (BYTE)uVar27;
          if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            sendplayer[uVar27] = BVar26;
          }
          auVar52._4_4_ = iVar78;
          auVar52._0_4_ = iVar78;
          auVar52._8_4_ = iVar82;
          auVar52._12_4_ = iVar82;
          auVar67 = auVar66 & auVar52 | auVar67;
          auVar31 = packssdw(auVar67,auVar67);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar65,auVar31 ^ auVar65);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._0_4_ >> 8 & 1) != 0) {
            sendplayer[uVar27 + 1] = BVar26 + '\x01';
          }
          auVar31 = auVar50 ^ auVar23;
          auVar53._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar53._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar53._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar53._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar68._4_4_ = auVar53._0_4_;
          auVar68._0_4_ = auVar53._0_4_;
          auVar68._8_4_ = auVar53._8_4_;
          auVar68._12_4_ = auVar53._8_4_;
          iVar78 = -(uint)(auVar31._4_4_ == iVar42);
          iVar82 = -(uint)(auVar31._12_4_ == iVar64);
          auVar10._4_4_ = iVar78;
          auVar10._0_4_ = iVar78;
          auVar10._8_4_ = iVar82;
          auVar10._12_4_ = iVar82;
          auVar79._4_4_ = auVar53._4_4_;
          auVar79._0_4_ = auVar53._4_4_;
          auVar79._8_4_ = auVar53._12_4_;
          auVar79._12_4_ = auVar53._12_4_;
          auVar31 = auVar10 & auVar68 | auVar79;
          auVar31 = packssdw(auVar31,auVar31);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar1,auVar31 ^ auVar1);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
            sendplayer[uVar27 + 2] = BVar26 + '\x02';
          }
          auVar31 = pshufhw(auVar31,auVar68,0x84);
          auVar11._4_4_ = iVar78;
          auVar11._0_4_ = iVar78;
          auVar11._8_4_ = iVar82;
          auVar11._12_4_ = iVar82;
          auVar65 = pshufhw(auVar53,auVar11,0x84);
          auVar61 = pshufhw(auVar31,auVar79,0x84);
          auVar32._8_4_ = 0xffffffff;
          auVar32._0_8_ = 0xffffffffffffffff;
          auVar32._12_4_ = 0xffffffff;
          auVar32 = (auVar61 | auVar65 & auVar31) ^ auVar32;
          auVar31 = packssdw(auVar32,auVar32);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._0_4_ >> 0x18 & 1) != 0) {
            sendplayer[uVar27 + 3] = BVar26 + '\x03';
          }
          auVar31 = auVar49 ^ auVar23;
          auVar54._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar54._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar54._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar54._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar12._4_4_ = auVar54._0_4_;
          auVar12._0_4_ = auVar54._0_4_;
          auVar12._8_4_ = auVar54._8_4_;
          auVar12._12_4_ = auVar54._8_4_;
          auVar65 = pshuflw(auVar79,auVar12,0xe8);
          auVar33._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
          auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
          auVar33._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
          auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
          auVar69._4_4_ = auVar33._4_4_;
          auVar69._0_4_ = auVar33._4_4_;
          auVar69._8_4_ = auVar33._12_4_;
          auVar69._12_4_ = auVar33._12_4_;
          auVar31 = pshuflw(auVar33,auVar69,0xe8);
          auVar70._4_4_ = auVar54._4_4_;
          auVar70._0_4_ = auVar54._4_4_;
          auVar70._8_4_ = auVar54._12_4_;
          auVar70._12_4_ = auVar54._12_4_;
          auVar61 = pshuflw(auVar54,auVar70,0xe8);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 & auVar65,(auVar61 | auVar31 & auVar65) ^ auVar2);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            sendplayer[uVar27 + 4] = BVar26 + '\x04';
          }
          auVar13._4_4_ = auVar54._0_4_;
          auVar13._0_4_ = auVar54._0_4_;
          auVar13._8_4_ = auVar54._8_4_;
          auVar13._12_4_ = auVar54._8_4_;
          auVar70 = auVar69 & auVar13 | auVar70;
          auVar61 = packssdw(auVar70,auVar70);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31,auVar61 ^ auVar3);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._4_2_ >> 8 & 1) != 0) {
            sendplayer[uVar27 + 5] = BVar26 + '\x05';
          }
          auVar31 = auVar48 ^ auVar23;
          auVar55._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar55._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar55._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar55._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar71._4_4_ = auVar55._0_4_;
          auVar71._0_4_ = auVar55._0_4_;
          auVar71._8_4_ = auVar55._8_4_;
          auVar71._12_4_ = auVar55._8_4_;
          iVar78 = -(uint)(auVar31._4_4_ == iVar42);
          iVar82 = -(uint)(auVar31._12_4_ == iVar64);
          auVar14._4_4_ = iVar78;
          auVar14._0_4_ = iVar78;
          auVar14._8_4_ = iVar82;
          auVar14._12_4_ = iVar82;
          auVar80._4_4_ = auVar55._4_4_;
          auVar80._0_4_ = auVar55._4_4_;
          auVar80._8_4_ = auVar55._12_4_;
          auVar80._12_4_ = auVar55._12_4_;
          auVar31 = auVar14 & auVar71 | auVar80;
          auVar31 = packssdw(auVar31,auVar31);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar4,auVar31 ^ auVar4);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            sendplayer[uVar27 + 6] = BVar26 + '\x06';
          }
          auVar31 = pshufhw(auVar31,auVar71,0x84);
          auVar15._4_4_ = iVar78;
          auVar15._0_4_ = iVar78;
          auVar15._8_4_ = iVar82;
          auVar15._12_4_ = iVar82;
          auVar65 = pshufhw(auVar55,auVar15,0x84);
          auVar61 = pshufhw(auVar31,auVar80,0x84);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar34 = (auVar61 | auVar65 & auVar31) ^ auVar34;
          auVar31 = packssdw(auVar34,auVar34);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._6_2_ >> 8 & 1) != 0) {
            sendplayer[uVar27 + 7] = BVar26 + '\a';
          }
          auVar31 = auVar47 ^ auVar23;
          auVar56._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar56._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar56._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar56._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar16._4_4_ = auVar56._0_4_;
          auVar16._0_4_ = auVar56._0_4_;
          auVar16._8_4_ = auVar56._8_4_;
          auVar16._12_4_ = auVar56._8_4_;
          auVar65 = pshuflw(auVar80,auVar16,0xe8);
          auVar35._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
          auVar35._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
          auVar35._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
          auVar35._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
          auVar72._4_4_ = auVar35._4_4_;
          auVar72._0_4_ = auVar35._4_4_;
          auVar72._8_4_ = auVar35._12_4_;
          auVar72._12_4_ = auVar35._12_4_;
          auVar31 = pshuflw(auVar35,auVar72,0xe8);
          auVar73._4_4_ = auVar56._4_4_;
          auVar73._0_4_ = auVar56._4_4_;
          auVar73._8_4_ = auVar56._12_4_;
          auVar73._12_4_ = auVar56._12_4_;
          auVar61 = pshuflw(auVar56,auVar73,0xe8);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar61 | auVar31 & auVar65) ^ auVar57;
          auVar61 = packssdw(auVar57,auVar57);
          auVar31 = packsswb(auVar31 & auVar65,auVar61);
          if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            PreGet::fromaddress.sin_zero[uVar27 - 8] = BVar26 + '\b';
          }
          auVar17._4_4_ = auVar56._0_4_;
          auVar17._0_4_ = auVar56._0_4_;
          auVar17._8_4_ = auVar56._8_4_;
          auVar17._12_4_ = auVar56._8_4_;
          auVar73 = auVar72 & auVar17 | auVar73;
          auVar61 = packssdw(auVar73,auVar73);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar61 = packssdw(auVar61 ^ auVar5,auVar61 ^ auVar5);
          auVar31 = packsswb(auVar31,auVar61);
          if ((auVar31._8_2_ >> 8 & 1) != 0) {
            PreGet::fromaddress.sin_zero[uVar27 - 7] = BVar26 + '\t';
          }
          auVar31 = auVar46 ^ auVar23;
          auVar58._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar58._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar58._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar58._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar74._4_4_ = auVar58._0_4_;
          auVar74._0_4_ = auVar58._0_4_;
          auVar74._8_4_ = auVar58._8_4_;
          auVar74._12_4_ = auVar58._8_4_;
          iVar78 = -(uint)(auVar31._4_4_ == iVar42);
          iVar82 = -(uint)(auVar31._12_4_ == iVar64);
          auVar18._4_4_ = iVar78;
          auVar18._0_4_ = iVar78;
          auVar18._8_4_ = iVar82;
          auVar18._12_4_ = iVar82;
          auVar81._4_4_ = auVar58._4_4_;
          auVar81._0_4_ = auVar58._4_4_;
          auVar81._8_4_ = auVar58._12_4_;
          auVar81._12_4_ = auVar58._12_4_;
          auVar31 = auVar18 & auVar74 | auVar81;
          auVar31 = packssdw(auVar31,auVar31);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar6,auVar31 ^ auVar6);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            PreGet::fromaddress.sin_zero[uVar27 - 6] = BVar26 + '\n';
          }
          auVar31 = pshufhw(auVar31,auVar74,0x84);
          auVar19._4_4_ = iVar78;
          auVar19._0_4_ = iVar78;
          auVar19._8_4_ = iVar82;
          auVar19._12_4_ = iVar82;
          auVar65 = pshufhw(auVar58,auVar19,0x84);
          auVar61 = pshufhw(auVar31,auVar81,0x84);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar36 = (auVar61 | auVar65 & auVar31) ^ auVar36;
          auVar31 = packssdw(auVar36,auVar36);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._10_2_ >> 8 & 1) != 0) {
            PreGet::fromaddress.sin_zero[uVar27 - 5] = BVar26 + '\v';
          }
          auVar31 = auVar45 ^ auVar23;
          auVar59._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar59._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar59._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar59._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar20._4_4_ = auVar59._0_4_;
          auVar20._0_4_ = auVar59._0_4_;
          auVar20._8_4_ = auVar59._8_4_;
          auVar20._12_4_ = auVar59._8_4_;
          auVar65 = pshuflw(auVar81,auVar20,0xe8);
          auVar37._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
          auVar37._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
          auVar37._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
          auVar37._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
          auVar75._4_4_ = auVar37._4_4_;
          auVar75._0_4_ = auVar37._4_4_;
          auVar75._8_4_ = auVar37._12_4_;
          auVar75._12_4_ = auVar37._12_4_;
          auVar31 = pshuflw(auVar37,auVar75,0xe8);
          auVar76._4_4_ = auVar59._4_4_;
          auVar76._0_4_ = auVar59._4_4_;
          auVar76._8_4_ = auVar59._12_4_;
          auVar76._12_4_ = auVar59._12_4_;
          auVar61 = pshuflw(auVar59,auVar76,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 & auVar65,(auVar61 | auVar31 & auVar65) ^ auVar7);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            PreGet::fromaddress.sin_zero[uVar27 - 4] = BVar26 + '\f';
          }
          auVar21._4_4_ = auVar59._0_4_;
          auVar21._0_4_ = auVar59._0_4_;
          auVar21._8_4_ = auVar59._8_4_;
          auVar21._12_4_ = auVar59._8_4_;
          auVar76 = auVar75 & auVar21 | auVar76;
          auVar61 = packssdw(auVar76,auVar76);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31,auVar61 ^ auVar8);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._12_2_ >> 8 & 1) != 0) {
            PreGet::fromaddress.sin_zero[uVar27 - 3] = BVar26 + '\r';
          }
          auVar31 = auVar43 ^ auVar23;
          auVar60._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
          auVar60._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
          auVar60._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
          auVar60._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
          auVar77._4_4_ = auVar60._0_4_;
          auVar77._0_4_ = auVar60._0_4_;
          auVar77._8_4_ = auVar60._8_4_;
          auVar77._12_4_ = auVar60._8_4_;
          iVar40 = -(uint)(auVar31._4_4_ == iVar42);
          iVar42 = -(uint)(auVar31._12_4_ == iVar64);
          auVar62._4_4_ = iVar40;
          auVar62._0_4_ = iVar40;
          auVar62._8_4_ = iVar42;
          auVar62._12_4_ = iVar42;
          auVar38._4_4_ = auVar60._4_4_;
          auVar38._0_4_ = auVar60._4_4_;
          auVar38._8_4_ = auVar60._12_4_;
          auVar38._12_4_ = auVar60._12_4_;
          auVar38 = auVar62 & auVar77 | auVar38;
          auVar31 = packssdw(auVar38,auVar38);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar31 = packssdw(auVar31 ^ auVar9,auVar31 ^ auVar9);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            PreGet::fromaddress.sin_zero[uVar27 - 2] = BVar26 + '\x0e';
          }
          auVar31 = pshufhw(auVar31,auVar77,0x84);
          in_XMM11 = pshufhw(auVar60,auVar62,0x84);
          in_XMM11 = in_XMM11 & auVar31;
          auVar22._4_4_ = auVar60._4_4_;
          auVar22._0_4_ = auVar60._4_4_;
          auVar22._8_4_ = auVar60._12_4_;
          auVar22._12_4_ = auVar60._12_4_;
          auVar31 = pshufhw(auVar31,auVar22,0x84);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar31 | in_XMM11) ^ auVar39;
          auVar31 = packssdw(auVar39,auVar39);
          auVar31 = packsswb(auVar31,auVar31);
          if ((auVar31._14_2_ >> 8 & 1) != 0) {
            PreGet::fromaddress.sin_zero[uVar27 - 1] = BVar26 + '\x0f';
          }
          uVar27 = uVar27 + 0x10;
          lVar29 = (long)DAT_0073c420;
          lVar44 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + lVar29;
          lVar41 = DAT_0073c420._8_8_;
          auVar51._8_8_ = lVar44 + lVar41;
          lVar44 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + lVar29;
          auVar50._8_8_ = lVar44 + lVar41;
          lVar44 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + lVar29;
          auVar49._8_8_ = lVar44 + lVar41;
          lVar44 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + lVar29;
          auVar48._8_8_ = lVar44 + lVar41;
          lVar44 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + lVar29;
          auVar47._8_8_ = lVar44 + lVar41;
          lVar44 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + lVar29;
          auVar46._8_8_ = lVar44 + lVar41;
          lVar44 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + lVar29;
          auVar45._8_8_ = lVar44 + lVar41;
          lVar44 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + lVar29;
          auVar43._8_8_ = lVar44 + lVar41;
          auVar31 = _DAT_0073c420;
        } while ((iVar24 + 0xfU & 0xfff0) != uVar27);
      }
      return;
    }
  }
  exit(0);
}

Assistant:

void HostGame (int i)
{
	PreGamePacket packet;
	int numplayers;
	int node;
	int gotack[MAXNETNODES+1];

	if ((i == Args->NumArgs() - 1) || !(numplayers = atoi (Args->GetArg(i+1))))
	{	// No player count specified, assume 2
		numplayers = 2;
	}

	if (numplayers > MAXNETNODES)
	{
		I_FatalError("You cannot host a game with %d players. The limit is currently %d.", numplayers, MAXNETNODES);
		return;
	}

	if (numplayers == 1)
	{ // Special case: Only 1 player, so don't bother starting the network
		netgame = false;
		multiplayer = true;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return;
	}

	StartNetwork (false);

	// [JC] - this computer is starting the game, therefore it should
	// be the Net Arbitrator.
	doomcom.consoleplayer = 0;
	Printf ("Console player number: %d\n", doomcom.consoleplayer);

	doomcom.numnodes = 1;

	atterm (SendAbort);

	StartScreen->NetInit ("Waiting for players", numplayers);

	// Wait for numplayers-1 different connections
	if (!StartScreen->NetLoop (Host_CheckForConnects, (void *)(intptr_t)numplayers))
	{
		exit (0);
	}

	// Now inform everyone of all machines involved in the game
	memset (gotack, 0, sizeof(gotack));
	StartScreen->NetMessage ("Sending all here.");
	StartScreen->NetInit ("Done waiting", 1);

	if (!StartScreen->NetLoop (Host_SendAllHere, (void *)gotack))
	{
		exit (0);
	}

	popterm ();

	// Now go
	StartScreen->NetMessage ("Go");
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_GO;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		// If we send the packets eight times to each guest,
		// hopefully at least one of them will get through.
		for (int i = 8; i != 0; --i)
		{
			PreSend (&packet, 2, &sendaddress[node]);
		}
	}

	StartScreen->NetMessage ("Total players: %d", doomcom.numnodes);

	doomcom.id = DOOMCOM_ID;
	doomcom.numplayers = doomcom.numnodes;

	// On the host, each player's number is the same as its node number
	for (i = 0; i < doomcom.numnodes; ++i)
	{
		sendplayer[i] = i;
	}
}